

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::setEquilibriumPoint(btGeneric6DofSpring2Constraint *this,int index)

{
  calculateTransforms(this);
  if (index < 3) {
    (this->m_linearLimits).m_equilibriumPoint.m_floats[index] =
         (this->m_calculatedLinearDiff).m_floats[index];
  }
  else {
    this->m_angularLimits[index - 3U].m_equilibriumPoint =
         (this->m_calculatedAxisAngleDiff).m_floats[index - 3U];
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setEquilibriumPoint(int index)
{
	btAssert((index >= 0) && (index < 6));
	calculateTransforms();
	if (index<3)
		m_linearLimits.m_equilibriumPoint[index] = m_calculatedLinearDiff[index];
	else
		m_angularLimits[index - 3] .m_equilibriumPoint = m_calculatedAxisAngleDiff[index - 3];
}